

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

void set_writer_options(bsdtar *bsdtar,archive *a)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint *puVar4;
  archive *in_RSI;
  char *p;
  int r;
  char *writer_options;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  pcVar2 = getenv("TAR_WRITER_OPTIONS");
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    in_stack_ffffffffffffffd8 = (char *)malloc(sVar3 + 0x1f);
    if (in_stack_ffffffffffffffd8 == (char *)0x0) {
      puVar4 = (uint *)__errno_location();
      lafe_errc(1,(int)(ulong)*puVar4,"Out of memory");
    }
    strncpy(in_stack_ffffffffffffffd8,"__ignore_wrong_module_name__,",0x1d);
    strcpy(in_stack_ffffffffffffffd8 + 0x1d,pcVar2);
    in_stack_ffffffffffffffe4 =
         archive_write_set_options
                   ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8);
    free(in_stack_ffffffffffffffd8);
    if (in_stack_ffffffffffffffe4 < -0x14) {
      pcVar2 = archive_error_string(in_RSI);
      lafe_errc(1,0,"%s",pcVar2);
    }
    archive_clear_error(in_RSI);
  }
  iVar1 = archive_write_set_options
                    ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
  if (iVar1 != 0) {
    pcVar2 = archive_error_string(in_RSI);
    lafe_errc(1,0,"%s",pcVar2);
  }
  return;
}

Assistant:

static void
set_writer_options(struct bsdtar *bsdtar, struct archive *a)
{
	const char *writer_options;
	int r;

	writer_options = getenv(ENV_WRITER_OPTIONS);
	if (writer_options != NULL) {
		char *p;
		/* Set default write options. */
		p = malloc(sizeof(IGNORE_WRONG_MODULE_NAME)
		    + strlen(writer_options) + 1);
		if (p == NULL)
			lafe_errc(1, errno, "Out of memory");
		/* Prepend magic code to ignore options for
		 * a format or filters which are not added to
		 * the archive write object. */
		strncpy(p, IGNORE_WRONG_MODULE_NAME,
		    sizeof(IGNORE_WRONG_MODULE_NAME) -1);
		strcpy(p + sizeof(IGNORE_WRONG_MODULE_NAME) -1, writer_options);
		r = archive_write_set_options(a, p);
		free(p);
		if (r < ARCHIVE_WARN)
			lafe_errc(1, 0, "%s", archive_error_string(a));
		else
			archive_clear_error(a);
	}
	if (ARCHIVE_OK != archive_write_set_options(a, bsdtar->option_options))
		lafe_errc(1, 0, "%s", archive_error_string(a));
}